

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O3

int run_test_loop_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  void *in_R10;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t loop;
  
  puVar3 = (uv_timer_t *)&loop;
  loop.data = puVar3;
  iVar1 = uv_loop_init(puVar3);
  if (iVar1 == 0) {
    in_R10 = loop.data;
    if ((uv_timer_t *)loop.data == puVar3) {
      puVar3 = &timer_handle;
      uv_timer_init(&loop,&timer_handle);
      uv_timer_start(&timer_handle,timer_cb,100,100);
      iVar1 = uv_loop_close(&loop);
      if (iVar1 == -0x10) {
        puVar3 = (uv_timer_t *)&loop;
        uv_run(puVar3,0);
        uv_close(&timer_handle,0);
        iVar1 = uv_run(puVar3,0);
        if (iVar1 != 0) goto LAB_001ab9fa;
        in_R10 = loop.data;
        if ((uv_timer_t *)loop.data == puVar3) {
          puVar3 = (uv_timer_t *)&loop;
          iVar1 = uv_loop_close(puVar3);
          if (iVar1 == 0) {
            in_R10 = loop.data;
            if ((uv_timer_t *)loop.data == puVar3) {
              return 0;
            }
          }
          else {
            run_test_loop_close_cold_4();
          }
          uVar2 = 0x36;
          goto LAB_001aba7a;
        }
      }
      else {
        run_test_loop_close_cold_2();
LAB_001ab9fa:
        run_test_loop_close_cold_3();
      }
      uVar2 = 0x34;
      goto LAB_001aba7a;
    }
  }
  else {
    run_test_loop_close_cold_1();
  }
  uVar2 = 0x27;
LAB_001aba7a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
          ,uVar2,"loop.data","==","(void*) &loop",in_R10,"==",puVar3);
  abort();
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT_EQ(UV_EBUSY, uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_PTR_EQ(loop.data, (void*) &loop);
  ASSERT_OK(uv_loop_close(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  return 0;
}